

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_c_tests.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TestSuite *pTVar3;
  long in_RSI;
  int in_EDI;
  TestReporter *reporter;
  TestSuite *suite;
  int suite_result;
  int local_14;
  
  uVar1 = create_named_test_suite_
                    ("all_c_tests",
                     "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/all_c_tests.c"
                     ,0x22);
  uVar2 = create_text_reporter();
  pTVar3 = assertion_tests();
  add_suite_(uVar1,"assertion_tests()",pTVar3);
  pTVar3 = breadcrumb_tests();
  add_suite_(uVar1,"breadcrumb_tests()",pTVar3);
  pTVar3 = cgreen_value_tests();
  add_suite_(uVar1,"cgreen_value_tests()",pTVar3);
  pTVar3 = cdash_reporter_tests();
  add_suite_(uVar1,"cdash_reporter_tests()",pTVar3);
  pTVar3 = constraint_tests();
  add_suite_(uVar1,"constraint_tests()",pTVar3);
  pTVar3 = cute_reporter_tests();
  add_suite_(uVar1,"cute_reporter_tests()",pTVar3);
  pTVar3 = message_formatting_tests();
  add_suite_(uVar1,"message_formatting_tests()",pTVar3);
  pTVar3 = messaging_tests();
  add_suite_(uVar1,"messaging_tests()",pTVar3);
  pTVar3 = mock_tests();
  add_suite_(uVar1,"mock_tests()",pTVar3);
  pTVar3 = parameter_tests();
  add_suite_(uVar1,"parameter_tests()",pTVar3);
  pTVar3 = reflective_no_teardown_tests();
  add_suite_(uVar1,"reflective_no_teardown_tests()",pTVar3);
  pTVar3 = reflective_tests();
  add_suite_(uVar1,"reflective_tests()",pTVar3);
  pTVar3 = text_reporter_tests();
  add_suite_(uVar1,"text_reporter_tests()",pTVar3);
  pTVar3 = unit_tests();
  add_suite_(uVar1,"unit_tests()",pTVar3);
  pTVar3 = vector_tests();
  add_suite_(uVar1,"vector_tests()",pTVar3);
  pTVar3 = xml_reporter_tests();
  add_suite_(uVar1,"xml_reporter_tests()",pTVar3);
  pTVar3 = libxml_reporter_tests();
  add_suite_(uVar1,"libxml_reporter_tests()",pTVar3);
  if (in_EDI < 2) {
    local_14 = run_test_suite(uVar1,uVar2);
  }
  else {
    local_14 = run_single_test(uVar1,*(undefined8 *)(in_RSI + 8),uVar2);
  }
  destroy_test_suite(uVar1);
  destroy_reporter(uVar2);
  return local_14;
}

Assistant:

int main(int argc, char **argv) {
    int suite_result;
    TestSuite *suite = create_named_test_suite("all_c_tests");
    TestReporter *reporter = create_text_reporter(); 

    add_suite(suite, assertion_tests());
    add_suite(suite, breadcrumb_tests());
    add_suite(suite, cgreen_value_tests());
    add_suite(suite, cdash_reporter_tests());
    add_suite(suite, constraint_tests());
#ifdef __cplusplus
    add_suite(suite, cpp_assertion_tests());
#endif
    add_suite(suite, cute_reporter_tests());
    add_suite(suite, message_formatting_tests());
    add_suite(suite, messaging_tests());
    add_suite(suite, mock_tests());
    add_suite(suite, parameter_tests());
    add_suite(suite, reflective_no_teardown_tests());
    add_suite(suite, reflective_tests());
    add_suite(suite, text_reporter_tests());
    add_suite(suite, unit_tests());
    add_suite(suite, vector_tests());
#if HAVE_XML_REPORTER
    add_suite(suite, xml_reporter_tests());
#endif
#if HAVE_LIBXML2_REPORTER
    add_suite(suite, libxml_reporter_tests());
#endif

    if (argc > 1) {
        suite_result = run_single_test(suite, argv[1], reporter);
    } else {
        suite_result = run_test_suite(suite, reporter);
    }

    destroy_test_suite(suite);
    destroy_reporter(reporter);

    return suite_result;
}